

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator(cmNinjaNormalTargetGenerator *this)

{
  cmNinjaNormalTargetGenerator *this_local;
  
  ~cmNinjaNormalTargetGenerator(this);
  operator_delete(this,0x108);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::~cmNinjaNormalTargetGenerator() = default;